

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.hpp
# Opt level: O2

void __thiscall
duckdb::LineError::Insert
          (LineError *this,CSVErrorType *type,idx_t *col_idx,idx_t *chunk_idx,
          LinePosition *error_position,idx_t current_line_size)

{
  reference pvVar1;
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  idx_t local_30;
  idx_t iStack_28;
  idx_t local_20;
  
  this->is_error_in_line = true;
  if (this->ignore_errors == false) {
    local_70[0] = *type;
    local_70._8_8_ = *col_idx;
    local_70._16_8_ = *chunk_idx;
    local_50._M_p = (pointer)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_30 = error_position->buffer_pos;
    iStack_28 = error_position->buffer_size;
    local_20 = error_position->buffer_idx;
    local_70._24_8_ = current_line_size;
    ::std::vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>::
    emplace_back<duckdb::CurrentError>
              ((vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_> *)this,
               (CurrentError *)local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
    pvVar1 = vector<duckdb::CurrentError,_true>::back(&this->current_errors);
    pvVar1->current_line_size = current_line_size;
  }
  return;
}

Assistant:

void Insert(const CSVErrorType &type, const idx_t &col_idx, const idx_t &chunk_idx,
	            const LinePosition &error_position, const idx_t current_line_size = 0) {
		is_error_in_line = true;
		if (!ignore_errors) {
			// We store it for later
			current_errors.push_back({type, col_idx, chunk_idx, error_position, current_line_size});
			current_errors.back().current_line_size = current_line_size;
		}
	}